

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

void __thiscall
wabt::interp::RefPtr<wabt::interp::Instance>::RefPtr
          (RefPtr<wabt::interp::Instance> *this,Store *store,Ref ref)

{
  Object *pOVar1;
  Instance *pIVar2;
  void *__src;
  long lVar3;
  Index IVar4;
  size_type __n;
  Ref *__dest;
  size_t *extraout_RDX;
  interp *this_00;
  size_t sVar5;
  void *__dest_00;
  Ref local_20;
  
  pOVar1 = (store->objects_).list_.
           super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
           _M_impl.super__Vector_impl_data._M_start[ref.index];
  if (((ulong)pOVar1 & 1) == 0) {
    this_00 = (interp *)(long)(int)pOVar1->kind_;
    if (this_00 != (interp *)0xb) {
      if (ref.index == 0) {
        this_00 = (interp *)0x0;
      }
      interp::RefPtr(this_00);
      __n = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::_M_check_len
                      ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)this_00,1,
                       "vector::_M_realloc_insert");
      __src = *(void **)this_00;
      lVar3 = *(long *)((new_allocator<wabt::interp::Ref> *)this_00 + 8);
      sVar5 = (long)store - (long)__src;
      if (__n == 0) {
        __dest = (Ref *)0x0;
      }
      else {
        __dest = __gnu_cxx::new_allocator<wabt::interp::Ref>::allocate
                           ((new_allocator<wabt::interp::Ref> *)this_00,__n,(void *)0x0);
      }
      __dest[(long)sVar5 >> 3].index = *extraout_RDX;
      if (0 < (long)sVar5) {
        memmove(__dest,__src,sVar5);
      }
      __dest_00 = (void *)((long)__dest + sVar5 + 8);
      sVar5 = lVar3 - (long)store;
      if (0 < (long)sVar5) {
        memmove(__dest_00,store,sVar5);
      }
      if (__src != (void *)0x0) {
        operator_delete(__src,*(long *)((new_allocator<wabt::interp::Ref> *)this_00 + 0x10) -
                              (long)__src);
      }
      *(Ref **)this_00 = __dest;
      *(size_t *)((new_allocator<wabt::interp::Ref> *)this_00 + 8) = (long)__dest_00 + sVar5;
      *(Ref **)((new_allocator<wabt::interp::Ref> *)this_00 + 0x10) = __dest + __n;
      return;
    }
    local_20.index = ref.index;
    IVar4 = FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&store->roots_,&local_20);
    this->root_index_ = IVar4;
    pIVar2 = (Instance *)
             (store->objects_).list_.
             super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
             _M_impl.super__Vector_impl_data._M_start[ref.index];
    if (((ulong)pIVar2 & 1) == 0) {
      this->obj_ = pIVar2;
      this->store_ = store;
      return;
    }
  }
  else if (ref.index == 0) {
    interp::RefPtr((interp *)0x0);
  }
  __assert_fail("IsUsed(index)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/interp/interp-inl.h"
                ,0xe5,
                "T &wabt::interp::FreeList<wabt::interp::Object *>::Get(Index) [T = wabt::interp::Object *]"
               );
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index));
  store_ = &store;
}